

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O0

h2o_cache_ref_t *
h2o_cache_fetch(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash)

{
  h2o_cache_ref_t *ref_00;
  khint_t kVar1;
  int64_t iVar2;
  int64_t timeleft;
  khiter_t iter;
  h2o_cache_ref_t *ref;
  h2o_cache_ref_t search_key;
  h2o_cache_hashcode_t keyhash_local;
  uint64_t now_local;
  h2o_cache_t *cache_local;
  h2o_iovec_t key_local;
  
  search_key._refcnt._4_4_ = keyhash;
  if (keyhash == 0) {
    search_key._refcnt._4_4_ = h2o_cache_calchash(key.base,key.len);
  }
  search_key.key.len._0_4_ = search_key._refcnt._4_4_;
  ref = (h2o_cache_ref_t *)key.base;
  search_key.key.base = (char *)key.len;
  lock_cache(cache);
  purge(cache,now);
  kVar1 = kh_get_cache(cache->table,(h2o_cache_ref_t *)&ref);
  if (kVar1 != cache->table->n_buckets) {
    ref_00 = cache->table->keys[kVar1];
    iVar2 = get_timeleft(cache,ref_00,now);
    if (-1 < iVar2) {
      if ((((cache->flags & 2U) == 0) || (9 < iVar2)) || (ref_00->_requested_early_update != 0)) {
        h2o_linklist_unlink(&ref_00->_lru_link);
        h2o_linklist_insert(&cache->lru,&ref_00->_lru_link);
        LOCK();
        ref_00->_refcnt = ref_00->_refcnt + 1;
        UNLOCK();
        unlock_cache(cache);
        return ref_00;
      }
      ref_00->_requested_early_update = 1;
    }
  }
  unlock_cache(cache);
  return (h2o_cache_ref_t *)0x0;
}

Assistant:

h2o_cache_ref_t *h2o_cache_fetch(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash)
{
    h2o_cache_ref_t search_key, *ref;
    khiter_t iter;
    int64_t timeleft;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);
    search_key.key = key;
    search_key.keyhash = keyhash;

    lock_cache(cache);

    purge(cache, now);

    if ((iter = kh_get(cache, cache->table, &search_key)) == kh_end(cache->table))
        goto NotFound;

    /* found */
    ref = kh_key(cache->table, iter);
    timeleft = get_timeleft(cache, ref, now);
    if (timeleft < 0)
        goto NotFound;
    if ((cache->flags & H2O_CACHE_FLAG_EARLY_UPDATE) != 0 && timeleft < 10 && !ref->_requested_early_update) {
        ref->_requested_early_update = 1;
        goto NotFound;
    }
    /* move the entry to the top of LRU */
    h2o_linklist_unlink(&ref->_lru_link);
    h2o_linklist_insert(&cache->lru, &ref->_lru_link);
    __sync_fetch_and_add(&ref->_refcnt, 1);

    /* unlock and return the found entry */
    unlock_cache(cache);
    return ref;

NotFound:
    unlock_cache(cache);
    return NULL;
}